

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

iter_type __thiscall
booster::locale::impl_icu::num_parse<wchar_t>::do_real_get<long_double>
          (num_parse<wchar_t> *this,iter_type in,iter_type end,ios_base *ios,iostate *err,
          longdouble *val)

{
  longdouble lVar1;
  bool bVar2;
  char_type_conflict cVar3;
  wchar_t wVar4;
  int iVar5;
  pointer pfVar6;
  ulong uVar7;
  undefined4 extraout_var;
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  num_parse<wchar_t> *in_RDI;
  undefined4 in_R8D;
  long in_R9;
  bool bVar8;
  istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> iVar9;
  iter_type iVar10;
  undefined4 in_stack_00000008;
  longdouble *in_stack_00000010;
  size_t n;
  size_t parsed_chars;
  cast_type value;
  wchar_t c;
  string_type tmp;
  stream_type *stream_ptr;
  formatter_ptr formatter;
  undefined4 in_stack_fffffffffffffe48;
  _Ios_Iostate in_stack_fffffffffffffe4c;
  undefined2 in_stack_fffffffffffffe50;
  undefined2 in_stack_fffffffffffffe52;
  int in_stack_fffffffffffffe54;
  istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  undefined2 in_stack_fffffffffffffe68;
  undefined2 uVar11;
  undefined6 uStack_196;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  long local_138;
  undefined8 local_120;
  undefined4 local_118;
  ulong local_110;
  double local_100;
  streambuf_type *local_f8;
  int_type local_f0;
  streambuf_type *local_e8;
  int_type local_e0;
  char_type_conflict local_d4;
  wstring local_d0 [36];
  undefined4 local_ac;
  undefined1 local_a8 [12];
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined8 local_88;
  byte local_69;
  long local_50;
  long local_40;
  undefined8 local_30;
  undefined4 uStack_28;
  undefined4 uStack_24;
  undefined8 local_20;
  undefined4 uStack_18;
  undefined1 local_10 [12];
  
  local_40 = in_R9;
  local_30 = in_RCX;
  uStack_28 = in_R8D;
  local_20 = in_RSI;
  uStack_18 = in_EDX;
  std::
  unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,std::default_delete<booster::locale::impl_icu::formatter<wchar_t>>>
  ::unique_ptr<std::default_delete<booster::locale::impl_icu::formatter<wchar_t>>,void>
            ((unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
              *)CONCAT44(in_stack_fffffffffffffe54,
                         CONCAT22(in_stack_fffffffffffffe52,in_stack_fffffffffffffe50)));
  if (local_40 == 0) {
    local_138 = 0;
  }
  else {
    local_138 = __dynamic_cast(local_40,&std::ios_base::typeinfo,&std::wistream::typeinfo,
                               0xffffffffffffffff);
  }
  local_50 = local_138;
  local_69 = 0;
  bVar8 = true;
  if (local_138 != 0) {
    lVar1 = (longdouble)0;
    in_stack_fffffffffffffe48 = SUB104(lVar1,0);
    in_stack_fffffffffffffe4c = (_Ios_Iostate)((unkuint10)lVar1 >> 0x20);
    in_stack_fffffffffffffe50 = (undefined2)((unkuint10)lVar1 >> 0x40);
    bVar2 = num_base::use_parent<long_double>
                      ((ios_base *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                       (longdouble)
                       CONCAT28(in_stack_fffffffffffffe68,
                                CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60)));
    bVar8 = true;
    if (!bVar2) {
      formatter<wchar_t>::create
                ((ios_base *)in_stack_fffffffffffffe58,
                 (Locale *)
                 CONCAT44(in_stack_fffffffffffffe54,
                          CONCAT22(in_stack_fffffffffffffe52,in_stack_fffffffffffffe50)),
                 (string *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      local_69 = 1;
      std::
      unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
      ::operator=((unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe54,
                              CONCAT22(in_stack_fffffffffffffe52,in_stack_fffffffffffffe50)),
                  (unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      pfVar6 = std::
               unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
               ::get((unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
                      *)CONCAT44(in_stack_fffffffffffffe54,
                                 CONCAT22(in_stack_fffffffffffffe52,in_stack_fffffffffffffe50)));
      bVar8 = pfVar6 == (pointer)0x0;
    }
  }
  if ((local_69 & 1) != 0) {
    std::
    unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
    ::~unique_ptr((unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe54,
                              CONCAT22(in_stack_fffffffffffffe52,in_stack_fffffffffffffe50)));
  }
  if (bVar8) {
    local_88 = local_20;
    local_98 = (undefined4)local_30;
    uStack_94 = local_30._4_4_;
    uStack_90 = uStack_28;
    uStack_8c = uStack_24;
    in_stack_fffffffffffffe50 = SUB82(in_stack_00000010,0);
    in_stack_fffffffffffffe52 = (undefined2)((ulong)in_stack_00000010 >> 0x10);
    in_stack_fffffffffffffe54 = (int)((ulong)in_stack_00000010 >> 0x20);
    local_a8 = std::num_get<wchar_t,std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>::
               do_get(in_RDI,local_20,uStack_18,local_30,uStack_28,local_40,in_stack_00000008);
    local_ac = 1;
    local_10 = local_a8;
  }
  else {
    std::__cxx11::wstring::wstring(local_d0);
    std::__cxx11::wstring::reserve((ulong)local_d0);
    while( true ) {
      bVar2 = std::operator!=((istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *)
                              CONCAT44(in_stack_fffffffffffffe54,
                                       CONCAT22(in_stack_fffffffffffffe52,in_stack_fffffffffffffe50)
                                      ),
                              (istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *)
                              CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      bVar8 = false;
      if ((bVar2) &&
         ((local_d4 = std::istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator*
                                ((istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *)
                                 CONCAT44(in_stack_fffffffffffffe54,
                                          CONCAT22(in_stack_fffffffffffffe52,
                                                   in_stack_fffffffffffffe50))), 0x20 < local_d4 ||
          (bVar8 = true, local_d4 < 1)))) {
        bVar8 = local_d4 == 0x7f;
      }
      if (!bVar8) break;
      std::istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator++
                ((istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *)
                 CONCAT44(in_stack_fffffffffffffe54,
                          CONCAT22(in_stack_fffffffffffffe52,in_stack_fffffffffffffe50)));
    }
    while( true ) {
      uVar7 = std::__cxx11::wstring::size();
      bVar8 = false;
      if (uVar7 < 0x1000) {
        bVar2 = std::operator!=((istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *)
                                CONCAT44(in_stack_fffffffffffffe54,
                                         CONCAT22(in_stack_fffffffffffffe52,
                                                  in_stack_fffffffffffffe50)),
                                (istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *)
                                CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        bVar8 = false;
        if (bVar2) {
          cVar3 = std::istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator*
                            ((istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *)
                             CONCAT44(in_stack_fffffffffffffe54,
                                      CONCAT22(in_stack_fffffffffffffe52,in_stack_fffffffffffffe50))
                            );
          bVar8 = cVar3 != 10;
        }
      }
      if (!bVar8) break;
      iVar9 = std::istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator++
                        (in_stack_fffffffffffffe58,in_stack_fffffffffffffe54);
      local_f8 = iVar9._M_sbuf;
      local_f0 = iVar9._M_c;
      local_e8 = local_f8;
      local_e0 = local_f0;
      wVar4 = std::istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator*
                        ((istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *)
                         CONCAT44(in_stack_fffffffffffffe54,
                                  CONCAT22(in_stack_fffffffffffffe52,in_stack_fffffffffffffe50)));
      std::__cxx11::wstring::operator+=(local_d0,wVar4);
    }
    pfVar6 = std::
             unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
             ::operator->((unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
                           *)0x28107e);
    iVar5 = (*(pfVar6->super_base_formatter)._vptr_base_formatter[5])(pfVar6,local_d0,&local_100);
    if ((CONCAT44(extraout_var,iVar5) == 0) ||
       (bVar8 = valid<long_double,double>(in_RDI,local_100), !bVar8)) {
      std::operator|=((_Ios_Iostate *)
                      CONCAT44(in_stack_fffffffffffffe54,
                               CONCAT22(in_stack_fffffffffffffe52,in_stack_fffffffffffffe50)),
                      in_stack_fffffffffffffe4c);
    }
    else {
      *in_stack_00000010 = (longdouble)local_100;
    }
    for (local_110 = std::__cxx11::wstring::size(); CONCAT44(extraout_var,iVar5) < local_110;
        local_110 = local_110 - 1) {
      uVar11 = (undefined2)local_50;
      uStack_196 = (undefined6)((ulong)local_50 >> 0x10);
      std::__cxx11::wstring::operator[]((ulong)local_d0);
      std::wistream::putback((wchar_t)CONCAT62(uStack_196,uVar11));
    }
    std::istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::istreambuf_iterator
              ((istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *)
               CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
               (istream_type *)in_stack_fffffffffffffe58);
    uStack_18 = local_118;
    local_20 = local_120;
    bVar8 = std::operator==((istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *)
                            CONCAT44(in_stack_fffffffffffffe54,
                                     CONCAT22(in_stack_fffffffffffffe52,in_stack_fffffffffffffe50)),
                            (istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *)
                            CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    if (bVar8) {
      std::operator|=((_Ios_Iostate *)
                      CONCAT44(in_stack_fffffffffffffe54,
                               CONCAT22(in_stack_fffffffffffffe52,in_stack_fffffffffffffe50)),
                      in_stack_fffffffffffffe4c);
    }
    local_10._0_8_ = local_20;
    local_10._8_4_ = uStack_18;
    local_ac = 1;
    std::__cxx11::wstring::~wstring(local_d0);
  }
  std::
  unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
  ::~unique_ptr((unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
                 *)CONCAT44(in_stack_fffffffffffffe54,
                            CONCAT22(in_stack_fffffffffffffe52,in_stack_fffffffffffffe50)));
  iVar10._12_4_ = 0;
  iVar10._M_sbuf = (streambuf_type *)local_10._0_8_;
  iVar10._M_c = local_10._8_4_;
  return iVar10;
}

Assistant:

iter_type do_real_get(iter_type in,iter_type end,std::ios_base &ios,std::ios_base::iostate &err,ValueType &val) const
    {
        formatter_ptr formatter;
        stream_type *stream_ptr = dynamic_cast<stream_type *>(&ios);

        if(!stream_ptr || use_parent<ValueType>(ios,0) || (formatter = formatter_type::create(ios,loc_,enc_)).get()==0) {
            return std::num_get<CharType>::do_get(in,end,ios,err,val);
        }

        typedef typename details::cast_traits<ValueType>::cast_type cast_type;
        string_type tmp;
        tmp.reserve(64);

        CharType c;
        while(in!=end && (((c=*in)<=32 && (c>0)) || c==127)) // Assuming that ASCII is a subset
            ++in;

        while(tmp.size() < 4096 && in!=end && *in!='\n') {
            tmp += *in++;
        }

        cast_type value;
        size_t parsed_chars;

        if((parsed_chars = formatter->parse(tmp,value))==0 || !valid<ValueType>(value)) {
            err |= std::ios_base::failbit;
        }
        else {
            val=static_cast<ValueType>(value);
        }

        for(size_t n=tmp.size();n>parsed_chars;n--) {
            stream_ptr->putback(tmp[n-1]);
        }

        in = iter_type(*stream_ptr);

        if(in==end)
            err |=std::ios_base::eofbit;
        return in;
    }